

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_rehash.cpp
# Opt level: O2

void __thiscall
RehashReplayer::set_application_info
          (RehashReplayer *this,Hash hash,VkApplicationInfo *info,
          VkPhysicalDeviceFeatures2 *features)

{
  bool bVar1;
  
  if ((this->should_filter_application_hash == false) &&
     ((this->has_set_application_info & 1U) != 0)) {
    fwrite("Fossilize ERROR: There are multiple VkApplicationInfo in this database. All blobs in this input database will be assigned to the first application info.\n"
           ,0x99,1,_stderr);
    return;
  }
  if (((this->has_set_application_info & 1U) == 0) &&
     ((this->should_filter_application_hash == false || (this->filter_application_hash == hash)))) {
    if (info != (VkApplicationInfo *)0x0) {
      bVar1 = Fossilize::StateRecorder::record_application_info(this->recorder,info);
      if (!bVar1) {
        fwrite("Fossilize ERROR: Failed to record application info.\n",0x34,1,_stderr);
      }
    }
    if (features != (VkPhysicalDeviceFeatures2 *)0x0) {
      bVar1 = Fossilize::StateRecorder::record_physical_device_features(this->recorder,features);
      if (!bVar1) {
        fwrite("Fossilize ERROR: Failed to record physical device features.\n",0x3c,1,_stderr);
      }
    }
    this->has_set_application_info = true;
  }
  return;
}

Assistant:

void set_application_info(Hash hash, const VkApplicationInfo *info, const VkPhysicalDeviceFeatures2 *features) override
	{
		if (!should_filter_application_hash && has_set_application_info)
		{
			LOGE("There are multiple VkApplicationInfo in this database. All blobs in this input database will be assigned to the first application info.\n");
		}
		else if (!has_set_application_info && (!should_filter_application_hash || hash == filter_application_hash))
		{
			if (info)
				if (!recorder->record_application_info(*info))
					LOGE("Failed to record application info.\n");
			if (features)
				if (!recorder->record_physical_device_features(features))
					LOGE("Failed to record physical device features.\n");
			has_set_application_info = true;
		}
	}